

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcrepo_value.cpp
# Opt level: O1

value_ptr __thiscall
pstore::dump::make_value
          (dump *this,shared_ptr<const_pstore::repo::compilation> *compilation,parameters *parm)

{
  element_type *peVar1;
  char *pcVar2;
  dump *pdVar3;
  ulong uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long lVar6;
  definition *member;
  value_ptr vVar7;
  initializer_list<pstore::dump::object::member> __l;
  container members;
  allocator_type local_149;
  undefined1 local_148 [32];
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_128;
  value_ptr local_110;
  dump *local_100;
  value_ptr local_f8;
  string local_e8;
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  local_c8;
  member local_a8;
  member local_78;
  indirect_string local_48;
  
  local_c8.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_100 = this;
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::reserve(&local_c8,
            (ulong)((compilation->
                    super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>)
                   ._M_ptr)->size_);
  peVar1 = (compilation->
           super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar4 = (ulong)peVar1->size_;
  if (uVar4 != 0) {
    lVar6 = uVar4 * 0x30;
    member = peVar1->members_;
    do {
      make_value((dump *)&local_a8,member,parm);
      std::
      vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
      ::emplace_back<std::shared_ptr<pstore::dump::value>>
                ((vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>
                  *)&local_c8,(shared_ptr<pstore::dump::value> *)&local_a8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8.property._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_a8.property._M_string_length);
      }
      member = member + 1;
      lVar6 = lVar6 + -0x30;
    } while (lVar6 != 0);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"members","");
  local_148._0_8_ = (array *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::array,std::allocator<pstore::dump::array>,std::vector<std::shared_ptr<pstore::dump::value>,std::allocator<std::shared_ptr<pstore::dump::value>>>const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_148 + 8),(array **)local_148,
             (allocator<pstore::dump::array> *)&local_48,&local_c8);
  local_110.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_148._0_8_;
  local_110.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_148._8_8_ + 8) = *(_Atomic_word *)(local_148._8_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
  }
  object::member::member(&local_a8,&local_e8,&local_110);
  local_148._0_8_ = (array *)(local_148 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"triple","");
  indirect_string::read
            ((int)&local_48,parm->db,
             (((compilation->
               super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->triple_).a_.a_);
  make_value((dump *)&local_f8,&local_48);
  object::member::member(&local_78,(string *)local_148,&local_f8);
  pdVar3 = local_100;
  __l._M_len = 2;
  __l._M_array = &local_a8;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_128,__l,&local_149);
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f1120;
  p_Var5[1]._vptr__Sp_counted_base = (_func_int **)&PTR__object_001f5ba0;
  *(pointer *)&p_Var5[1]._M_use_count =
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var5[2]._vptr__Sp_counted_base =
       (_func_int **)
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)&p_Var5[2]._M_use_count =
       local_128.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&p_Var5[3]._vptr__Sp_counted_base = 0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)pdVar3 = p_Var5 + 1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pdVar3 + 8) = p_Var5;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var5->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_128);
  lVar6 = 0;
  do {
    p_Var5 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              ((long)&local_78.val.
                      super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi + lVar6);
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    pcVar2 = *(char **)((long)&local_78.property._M_dataplus._M_p + lVar6);
    if (local_78.property.field_2._M_local_buf + lVar6 != pcVar2) {
      operator_delete(pcVar2,*(long *)((long)&local_78.property.field_2 + lVar6) + 1);
    }
    lVar6 = lVar6 + -0x30;
  } while (lVar6 != -0x60);
  if (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((array *)local_148._0_8_ != (array *)(local_148 + 0x10)) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  if (local_110.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector(&local_c8);
  vVar7.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar7.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pdVar3;
  return (value_ptr)vVar7.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

value_ptr make_value (std::shared_ptr<repo::compilation const> const & compilation,
                              parameters const & parm) {
            array::container members;
            members.reserve (compilation->size ());
            for (auto const & member : *compilation) {
                members.emplace_back (make_value (member, parm));
            }

            using namespace serialize;
            using archive::make_reader;
            return make_value (object::container{
                {"members", make_value (members)},
                {"triple", make_value (indirect_string::read (parm.db, compilation->triple ()))},
            });
        }